

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBlock(TranslateToFuzzReader *this,Type type)

{
  pointer *pppEVar1;
  int iVar2;
  uintptr_t uVar3;
  bool bVar4;
  uint32_t uVar5;
  Block *left;
  Expression *pEVar6;
  ulong uVar7;
  uint32_t uVar8;
  bool bVar9;
  string_view sVar10;
  optional<wasm::Type> type_00;
  Block *local_48;
  Builder *local_40;
  Random *local_38;
  
  left = MixedArena::alloc<wasm::Block>((MixedArena *)((this->builder).wasm + 0x200));
  (left->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = type.id;
  sVar10 = (string_view)makeLabel(this);
  (left->name).super_IString.str = sVar10;
  local_48 = left;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &this->funcContext->breakableStack,(Expression **)&local_48);
  local_38 = &this->random;
  uVar5 = Random::upToSquared(local_38,(this->fuzzParams->super_FuzzParams).BLOCK_FACTOR - 1);
  iVar2 = (this->fuzzParams->super_FuzzParams).NESTING_LIMIT;
  uVar8 = uVar5;
  if ((iVar2 / 2 <= this->nesting) && (uVar8 = uVar5 >> 1, iVar2 <= this->nesting)) {
    bVar4 = Random::oneIn(local_38,2);
    if (bVar4) {
      uVar8 = uVar5 >> 2;
    }
  }
  if (uVar8 == 0) {
    bVar4 = Random::oneIn(local_38,10);
    uVar8 = (uint32_t)!bVar4;
  }
  local_40 = &this->builder;
  while( true ) {
    bVar4 = (this->random).finishedInput;
    bVar9 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar9) break;
    if ((bVar4 & 1U) != 0) goto LAB_0013e1a0;
    pEVar6 = make(this,(Type)0x0);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(left->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar6);
  }
  if (((bVar4 & 1U) == 0 && 1 < type.id) && (bVar4 = Random::oneIn(local_38,2), bVar4)) {
    pEVar6 = makeBreak(this,(Type)0x1);
  }
  else {
LAB_0013e1a0:
    pEVar6 = make(this,type);
  }
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(left->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar6);
  pppEVar1 = &(this->funcContext->breakableStack).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar1 = *pppEVar1 + -1;
  uVar7 = 0;
  wasm::Block::finalize(left);
  uVar3 = (left->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  if (uVar3 != type.id) {
    if ((type.id != 1) || (uVar3 != 0)) {
      __assert_fail("type == Type::unreachable && ret->type == Type::none",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x91b,"Expression *wasm::TranslateToFuzzReader::makeBlock(Type)");
    }
    pEVar6 = make(this,(Type)0x1);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar7;
    left = Builder::makeSequence(local_40,(Expression *)left,pEVar6,type_00);
  }
  return (Expression *)left;
}

Assistant:

Expression* TranslateToFuzzReader::makeBlock(Type type) {
  auto* ret = builder.makeBlock();
  ret->type = type; // so we have it during child creation
  ret->name = makeLabel();
  funcContext->breakableStack.push_back(ret);
  Index num = upToSquared(fuzzParams->BLOCK_FACTOR - 1); // we add another later
  if (nesting >= fuzzParams->NESTING_LIMIT / 2) {
    // smaller blocks past the limit
    num /= 2;
    if (nesting >= fuzzParams->NESTING_LIMIT && oneIn(2)) {
      // smaller blocks past the limit
      num /= 2;
    }
  }
  // not likely to have a block of size 1
  if (num == 0 && !oneIn(10)) {
    num++;
  }
  while (num > 0 && !random.finished()) {
    ret->list.push_back(make(Type::none));
    num--;
  }
  // give a chance to make the final element an unreachable break, instead
  // of concrete - a common pattern (branch to the top of a loop etc.)
  if (!random.finished() && type.isConcrete() && oneIn(2)) {
    ret->list.push_back(makeBreak(Type::unreachable));
  } else {
    ret->list.push_back(make(type));
  }
  funcContext->breakableStack.pop_back();
  if (type.isConcrete()) {
    ret->finalize(type);
  } else {
    ret->finalize();
  }
  if (ret->type != type) {
    // e.g. we might want an unreachable block, but a child breaks to it
    assert(type == Type::unreachable && ret->type == Type::none);
    return builder.makeSequence(ret, make(Type::unreachable));
  }
  return ret;
}